

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefidump.h
# Opt level: O1

void __thiscall UEFIDumper::UEFIDumper(UEFIDumper *this)

{
  TreeModel::TreeModel(&this->model);
  FfsParser::FfsParser(&this->ffsParser,&this->model);
  (this->ffsReport).model = &this->model;
  (this->currentBuffer).d._M_dataplus._M_p = (pointer)&(this->currentBuffer).d.field_2;
  (this->currentBuffer).d._M_string_length = 0;
  (this->currentBuffer).d.field_2._M_local_buf[0] = '\0';
  this->initialized = false;
  this->dumped = false;
  return;
}

Assistant:

explicit UEFIDumper() : model(), ffsParser(&model), ffsReport(&model), currentBuffer(), initialized(false), dumped(false) {}